

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O2

HairMaterial *
pbrt::HairMaterial::Create(TextureParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  uintptr_t iptr_1;
  HairMaterial *pHVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *message;
  uintptr_t iptr;
  undefined8 uVar6;
  undefined8 uVar7;
  RGBUnboundedSpectrum RVar8;
  string asStack_b8 [39];
  allocator<char> local_91;
  FloatTextureHandle pheomelanin;
  FloatTextureHandle eumelanin;
  SpectrumTextureHandle color;
  SpectrumTextureHandle sigma_a;
  FloatTextureHandle eta;
  FloatTextureHandle alpha;
  FloatTextureHandle beta_n;
  FloatTextureHandle beta_m;
  Allocator alloc_local;
  
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>(asStack_b8,"sigma_a",(allocator<char> *)&color)
  ;
  TextureParameterDictionary::GetSpectrumTextureOrNull
            ((TextureParameterDictionary *)&sigma_a,(string *)parameters,(SpectrumType)asStack_b8,
             (Allocator)0x1);
  std::__cxx11::string::~string(asStack_b8);
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_b8,"color",(allocator<char> *)&eumelanin);
  TextureParameterDictionary::GetSpectrumTextureOrNull
            ((TextureParameterDictionary *)&color,(string *)parameters,(SpectrumType)asStack_b8,
             (Allocator)0x0);
  std::__cxx11::string::~string(asStack_b8);
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_b8,"eumelanin",(allocator<char> *)&pheomelanin);
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)&eumelanin,(string *)parameters,
             (memory_resource *)asStack_b8);
  std::__cxx11::string::~string(asStack_b8);
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_b8,"pheomelanin",(allocator<char> *)&eta);
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)&pheomelanin,(string *)parameters,
             (memory_resource *)asStack_b8);
  std::__cxx11::string::~string(asStack_b8);
  if (((ulong)sigma_a.
              super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits & 0xffffffffffff) == 0) {
    if (((ulong)color.
                super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                .bits & 0xffffffffffff) == 0) {
      if ((((ulong)eumelanin.
                   super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                   .bits & 0xffffffffffff) == 0) &&
         (((ulong)pheomelanin.
                  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                  .bits & 0xffffffffffff) == 0)) {
        uVar6 = 0;
        uVar7 = 0;
        RVar8 = HairBxDF::SigmaAFromConcentration(1.3,0.0);
        iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x10,4);
        auVar2._8_8_ = uVar6;
        auVar2._0_8_ = RVar8._0_8_;
        auVar1._8_8_ = uVar7;
        auVar1._0_8_ = RVar8.rsp._4_8_;
        auVar1 = vunpcklpd_avx(auVar2,auVar1);
        *(undefined1 (*) [16])CONCAT44(extraout_var,iVar3) = auVar1;
        iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,8);
        *(ulong *)CONCAT44(extraout_var_00,iVar4) = CONCAT44(extraout_var,iVar3) | 0x5000000000000;
        sigma_a.
        super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
        .bits = (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                 )(CONCAT44(extraout_var_00,iVar4) | 0x5000000000000);
      }
      goto LAB_0032a699;
    }
    if (((ulong)eumelanin.
                super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                .bits & 0xffffffffffff) != 0) {
      Warning(loc,"Ignoring \"eumelanin\" parameter since \"color\" was provided.");
    }
    if (((ulong)pheomelanin.
                super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                .bits & 0xffffffffffff) == 0) goto LAB_0032a699;
    message = "Ignoring \"pheomelanin\" parameter since \"color\" was provided.";
  }
  else {
    if (((ulong)color.
                super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                .bits & 0xffffffffffff) != 0) {
      Warning(loc,"Ignoring \"color\" parameter since \"sigma_a\" was provided.");
    }
    if (((ulong)eumelanin.
                super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                .bits & 0xffffffffffff) != 0) {
      Warning(loc,"Ignoring \"eumelanin\" parameter since \"sigma_a\" was provided.");
    }
    if (((ulong)pheomelanin.
                super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                .bits & 0xffffffffffff) == 0) goto LAB_0032a699;
    message = "Ignoring \"pheomelanin\" parameter since \"sigma_a\" was provided.";
  }
  Warning(loc,message);
LAB_0032a699:
  std::__cxx11::string::string<std::allocator<char>>(asStack_b8,"eta",(allocator<char> *)&beta_m);
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)&eta,(string *)parameters,1.55,
             (memory_resource *)asStack_b8);
  std::__cxx11::string::~string(asStack_b8);
  std::__cxx11::string::string<std::allocator<char>>(asStack_b8,"beta_m",(allocator<char> *)&beta_n)
  ;
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)&beta_m,(string *)parameters,0.3,
             (memory_resource *)asStack_b8);
  std::__cxx11::string::~string(asStack_b8);
  std::__cxx11::string::string<std::allocator<char>>(asStack_b8,"beta_n",(allocator<char> *)&alpha);
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)&beta_n,(string *)parameters,0.3,
             (memory_resource *)asStack_b8);
  std::__cxx11::string::~string(asStack_b8);
  std::__cxx11::string::string<std::allocator<char>>(asStack_b8,"alpha",&local_91);
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)&alpha,(string *)parameters,2.0,
             (memory_resource *)asStack_b8);
  std::__cxx11::string::~string(asStack_b8);
  pHVar5 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::HairMaterial,pbrt::SpectrumTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&>
                     (&alloc_local,&sigma_a,&color,&eumelanin,&pheomelanin,&eta,&beta_m,&beta_n,
                      &alpha);
  return pHVar5;
}

Assistant:

HairMaterial *HairMaterial::Create(const TextureParameterDictionary &parameters,
                                   const FileLoc *loc, Allocator alloc) {
    SpectrumTextureHandle sigma_a =
        parameters.GetSpectrumTextureOrNull("sigma_a", SpectrumType::Unbounded, alloc);
    SpectrumTextureHandle color =
        parameters.GetSpectrumTextureOrNull("color", SpectrumType::Albedo, alloc);
    FloatTextureHandle eumelanin = parameters.GetFloatTextureOrNull("eumelanin", alloc);
    FloatTextureHandle pheomelanin =
        parameters.GetFloatTextureOrNull("pheomelanin", alloc);
    if (sigma_a) {
        if (color)
            Warning(loc, R"(Ignoring "color" parameter since "sigma_a" was provided.)");
        if (eumelanin)
            Warning(loc, "Ignoring \"eumelanin\" parameter since \"sigma_a\" was "
                         "provided.");
        if (pheomelanin)
            Warning(loc, "Ignoring \"pheomelanin\" parameter since \"sigma_a\" was "
                         "provided.");
    } else if (color) {
        if (sigma_a)
            Warning(loc, R"(Ignoring "sigma_a" parameter since "color" was provided.)");
        if (eumelanin)
            Warning(loc, "Ignoring \"eumelanin\" parameter since \"color\" was "
                         "provided.");
        if (pheomelanin)
            Warning(loc, "Ignoring \"pheomelanin\" parameter since \"color\" was "
                         "provided.");
    } else if (eumelanin || pheomelanin) {
        if (sigma_a)
            Warning(loc, "Ignoring \"sigma_a\" parameter since "
                         "\"eumelanin\"/\"pheomelanin\" was provided.");
        if (color)
            Warning(loc, "Ignoring \"color\" parameter since "
                         "\"eumelanin\"/\"pheomelanin\" was provided.");
    } else {
        // Default: brown-ish hair.
        sigma_a = alloc.new_object<SpectrumConstantTexture>(
            alloc.new_object<RGBUnboundedSpectrum>(
                HairBxDF::SigmaAFromConcentration(1.3, 0.)));
    }

    FloatTextureHandle eta = parameters.GetFloatTexture("eta", 1.55f, alloc);
    FloatTextureHandle beta_m = parameters.GetFloatTexture("beta_m", 0.3f, alloc);
    FloatTextureHandle beta_n = parameters.GetFloatTexture("beta_n", 0.3f, alloc);
    FloatTextureHandle alpha = parameters.GetFloatTexture("alpha", 2.f, alloc);

    return alloc.new_object<HairMaterial>(sigma_a, color, eumelanin, pheomelanin, eta,
                                          beta_m, beta_n, alpha);
}